

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_rc_postencode_update(AV1_COMP *cpi,uint64_t bytes_used)

{
  uint64_t uVar1;
  AV1_PRIMARY *pAVar2;
  int iVar3;
  AV1_COMMON *cm_00;
  long in_RSI;
  AV1_COMP *in_RDI;
  bool bVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  AV1_COMP *unaff_retaddr;
  int this_bit_est_ratio;
  double q;
  int qindex;
  int is_intrnl_arf;
  RefreshFrameInfo *refresh_frame;
  GF_GROUP *gf_group;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  AV1_COMMON *in_stack_ffffffffffffff90;
  int local_64;
  int in_stack_ffffffffffffffac;
  AV1_COMP *in_stack_ffffffffffffffb0;
  AV1_COMP *cpi_00;
  
  cm_00 = &in_RDI->common;
  pAVar2 = in_RDI->ppi;
  bVar4 = (in_RDI->ppi->gf_group).update_type[in_RDI->gf_frame_index] == '\x06';
  iVar3 = (in_RDI->common).quant_params.base_qindex;
  (in_RDI->rc).projected_frame_size = (int)(in_RSI << 3);
  cpi_00 = in_RDI;
  av1_rc_update_rate_correction_factors
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20));
  if ((((cpi_00->oxcf).rc_cfg.mode == AOM_CBR) && ((cm_00->current_frame).frame_type != '\0')) &&
     ((cpi_00->sf).hl_sf.accurate_bit_estimate != 0)) {
    in_stack_ffffffffffffffb0 =
         (AV1_COMP *)av1_convert_qindex_to_q(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    dVar5 = (double)(in_RDI->rc).projected_frame_size * (double)in_stack_ffffffffffffffb0;
    uVar1 = cpi_00->rec_sse;
    auVar7._8_4_ = (int)(uVar1 >> 0x20);
    auVar7._0_8_ = uVar1;
    auVar7._12_4_ = 0x45300000;
    dVar6 = sqrt((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    in_stack_ffffffffffffffac = (int)(dVar5 / dVar6);
    local_64 = in_stack_ffffffffffffffac;
    if ((cpi_00->rc).bit_est_ratio != 0) {
      local_64 = ((cpi_00->rc).bit_est_ratio * 7 + in_stack_ffffffffffffffac) / 8;
    }
    (cpi_00->rc).bit_est_ratio = local_64;
  }
  if ((cm_00->current_frame).frame_type == '\0') {
    (pAVar2->p_rc).last_q[0] = iVar3;
    (pAVar2->p_rc).avg_frame_qindex[0] = (pAVar2->p_rc).avg_frame_qindex[0] * 3 + iVar3 + 2 >> 2;
    if ((cpi_00->svc).spatial_layer_id == 0) {
      (in_RDI->rc).last_encoded_size_keyframe = (in_RDI->rc).projected_frame_size;
      (in_RDI->rc).last_target_size_keyframe = (in_RDI->rc).this_frame_target;
    }
  }
  else if ((((cpi_00->ppi->use_svc != 0) && ((cpi_00->oxcf).rc_cfg.mode == AOM_CBR)) ||
           ((cpi_00->rc).rtc_external_ratectrl != 0)) ||
          ((((in_RDI->rc).is_src_frame_alt_ref == 0 &&
            (((in_RDI->refresh_frame).golden_frame & 1U) == 0)) &&
           ((!bVar4 && (((in_RDI->refresh_frame).alt_ref_frame & 1U) == 0)))))) {
    (pAVar2->p_rc).last_q[1] = iVar3;
    (pAVar2->p_rc).avg_frame_qindex[1] = (pAVar2->p_rc).avg_frame_qindex[1] * 3 + iVar3 + 2 >> 2;
    (pAVar2->p_rc).ni_frames = (pAVar2->p_rc).ni_frames + 1;
    dVar5 = av1_convert_qindex_to_q(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    (pAVar2->p_rc).tot_q = dVar5 + (pAVar2->p_rc).tot_q;
    (pAVar2->p_rc).avg_q = (pAVar2->p_rc).tot_q / (double)(pAVar2->p_rc).ni_frames;
    (in_RDI->rc).ni_tot_qi = iVar3 + (in_RDI->rc).ni_tot_qi;
    (in_RDI->rc).ni_av_qi = (in_RDI->rc).ni_tot_qi / (pAVar2->p_rc).ni_frames;
  }
  if (((iVar3 < (pAVar2->p_rc).last_boosted_qindex) || ((cm_00->current_frame).frame_type == '\0'))
     || (((pAVar2->p_rc).constrained_gf_group == 0 &&
         (((((in_RDI->refresh_frame).alt_ref_frame & 1U) != 0 || (bVar4)) ||
          ((((in_RDI->refresh_frame).golden_frame & 1U) != 0 &&
           ((in_RDI->rc).is_src_frame_alt_ref == 0)))))))) {
    (pAVar2->p_rc).last_boosted_qindex = iVar3;
  }
  if ((cm_00->current_frame).frame_type == '\0') {
    (pAVar2->p_rc).last_kf_qindex = iVar3;
  }
  update_buffer_level(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  (in_RDI->rc).prev_avg_frame_bandwidth = (in_RDI->rc).avg_frame_bandwidth;
  iVar3 = av1_frame_scaled(in_stack_ffffffffffffff90);
  if (iVar3 != 0) {
    dVar5 = (double)(in_RDI->rc).this_frame_target;
    dVar6 = resize_rate_factor(&(cpi_00->oxcf).frm_dim_cfg,(in_RDI->common).width,
                               (in_RDI->common).height);
    iVar3 = saturate_cast_double_to_int(dVar5 / dVar6);
    (in_RDI->rc).this_frame_target = iVar3;
  }
  if ((cm_00->current_frame).frame_type != '\0') {
    (pAVar2->p_rc).rolling_target_bits =
         (int)((long)(pAVar2->p_rc).rolling_target_bits * 3 + (long)(in_RDI->rc).this_frame_target +
               2 >> 2);
    (pAVar2->p_rc).rolling_actual_bits =
         (int)((long)(pAVar2->p_rc).rolling_actual_bits * 3 +
               (long)(in_RDI->rc).projected_frame_size + 2 >> 2);
  }
  (pAVar2->p_rc).total_actual_bits =
       (long)(in_RDI->rc).projected_frame_size + (pAVar2->p_rc).total_actual_bits;
  if ((in_RDI->common).show_frame == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = (in_RDI->rc).avg_frame_bandwidth;
  }
  (pAVar2->p_rc).total_target_bits = (long)iVar3 + (pAVar2->p_rc).total_target_bits;
  iVar3 = is_altref_enabled((cpi_00->oxcf).gf_cfg.lag_in_frames,
                            (_Bool)((cpi_00->oxcf).gf_cfg.enable_auto_arf & 1));
  if ((((iVar3 == 0) || (((in_RDI->refresh_frame).alt_ref_frame & 1U) == 0)) ||
      ((cm_00->current_frame).frame_type == '\0')) || (iVar3 = frame_is_sframe(cm_00), iVar3 != 0))
  {
    update_golden_frame_stats(cpi_00);
  }
  else {
    update_alt_ref_frame_stats(cpi_00);
  }
  if ((cm_00->current_frame).frame_type == '\0') {
    (in_RDI->rc).frames_since_key = 0;
    (in_RDI->rc).frames_since_scene_change = 0;
  }
  if (((cpi_00->refresh_frame).golden_frame & 1U) != 0) {
    (in_RDI->rc).frame_num_last_gf_refresh = (in_RDI->common).current_frame.frame_number;
  }
  (in_RDI->rc).prev_coded_width = (in_RDI->common).width;
  (in_RDI->rc).prev_coded_height = (in_RDI->common).height;
  (in_RDI->rc).frame_number_encoded = (in_RDI->rc).frame_number_encoded + 1;
  (in_RDI->rc).prev_frame_is_dropped = 0;
  (in_RDI->rc).drop_count_consec = 0;
  return;
}

Assistant:

void av1_rc_postencode_update(AV1_COMP *cpi, uint64_t bytes_used) {
  const AV1_COMMON *const cm = &cpi->common;
  const CurrentFrame *const current_frame = &cm->current_frame;
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;

  const int is_intrnl_arf =
      gf_group->update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE;

  const int qindex = cm->quant_params.base_qindex;

#if RT_PASSIVE_STRATEGY
  const int frame_number = current_frame->frame_number % MAX_Q_HISTORY;
  p_rc->q_history[frame_number] = qindex;
#endif  // RT_PASSIVE_STRATEGY

  // Update rate control heuristics
  rc->projected_frame_size = (int)(bytes_used << 3);

  // Post encode loop adjustment of Q prediction.
  av1_rc_update_rate_correction_factors(cpi, 0, cm->width, cm->height);

  // Update bit estimation ratio.
  if (cpi->oxcf.rc_cfg.mode == AOM_CBR &&
      cm->current_frame.frame_type != KEY_FRAME &&
      cpi->sf.hl_sf.accurate_bit_estimate) {
    const double q = av1_convert_qindex_to_q(cm->quant_params.base_qindex,
                                             cm->seq_params->bit_depth);
    const int this_bit_est_ratio =
        (int)(rc->projected_frame_size * q / sqrt((double)cpi->rec_sse));
    cpi->rc.bit_est_ratio =
        cpi->rc.bit_est_ratio == 0
            ? this_bit_est_ratio
            : (7 * cpi->rc.bit_est_ratio + this_bit_est_ratio) / 8;
  }

  // Keep a record of last Q and ambient average Q.
  if (current_frame->frame_type == KEY_FRAME) {
    p_rc->last_q[KEY_FRAME] = qindex;
    p_rc->avg_frame_qindex[KEY_FRAME] =
        ROUND_POWER_OF_TWO(3 * p_rc->avg_frame_qindex[KEY_FRAME] + qindex, 2);
    if (cpi->svc.spatial_layer_id == 0) {
      rc->last_encoded_size_keyframe = rc->projected_frame_size;
      rc->last_target_size_keyframe = rc->this_frame_target;
    }
  } else {
    if ((cpi->ppi->use_svc && cpi->oxcf.rc_cfg.mode == AOM_CBR) ||
        cpi->rc.rtc_external_ratectrl ||
        (!rc->is_src_frame_alt_ref &&
         !(refresh_frame->golden_frame || is_intrnl_arf ||
           refresh_frame->alt_ref_frame))) {
      p_rc->last_q[INTER_FRAME] = qindex;
      p_rc->avg_frame_qindex[INTER_FRAME] = ROUND_POWER_OF_TWO(
          3 * p_rc->avg_frame_qindex[INTER_FRAME] + qindex, 2);
      p_rc->ni_frames++;
      p_rc->tot_q += av1_convert_qindex_to_q(qindex, cm->seq_params->bit_depth);
      p_rc->avg_q = p_rc->tot_q / p_rc->ni_frames;
      // Calculate the average Q for normal inter frames (not key or GFU
      // frames).
      rc->ni_tot_qi += qindex;
      rc->ni_av_qi = rc->ni_tot_qi / p_rc->ni_frames;
    }
  }
  // Keep record of last boosted (KF/GF/ARF) Q value.
  // If the current frame is coded at a lower Q then we also update it.
  // If all mbs in this group are skipped only update if the Q value is
  // better than that already stored.
  // This is used to help set quality in forced key frames to reduce popping
  if ((qindex < p_rc->last_boosted_qindex) ||
      (current_frame->frame_type == KEY_FRAME) ||
      (!p_rc->constrained_gf_group &&
       (refresh_frame->alt_ref_frame || is_intrnl_arf ||
        (refresh_frame->golden_frame && !rc->is_src_frame_alt_ref)))) {
    p_rc->last_boosted_qindex = qindex;
  }
  if (current_frame->frame_type == KEY_FRAME) p_rc->last_kf_qindex = qindex;

  update_buffer_level(cpi, rc->projected_frame_size);
  rc->prev_avg_frame_bandwidth = rc->avg_frame_bandwidth;

  // Rolling monitors of whether we are over or underspending used to help
  // regulate min and Max Q in two pass.
  if (av1_frame_scaled(cm))
    rc->this_frame_target = saturate_cast_double_to_int(
        rc->this_frame_target /
        resize_rate_factor(&cpi->oxcf.frm_dim_cfg, cm->width, cm->height));
  if (current_frame->frame_type != KEY_FRAME) {
    p_rc->rolling_target_bits = (int)ROUND_POWER_OF_TWO_64(
        (int64_t)p_rc->rolling_target_bits * 3 + rc->this_frame_target, 2);
    p_rc->rolling_actual_bits = (int)ROUND_POWER_OF_TWO_64(
        (int64_t)p_rc->rolling_actual_bits * 3 + rc->projected_frame_size, 2);
  }

  // Actual bits spent
  p_rc->total_actual_bits += rc->projected_frame_size;
  p_rc->total_target_bits += cm->show_frame ? rc->avg_frame_bandwidth : 0;

  if (is_altref_enabled(cpi->oxcf.gf_cfg.lag_in_frames,
                        cpi->oxcf.gf_cfg.enable_auto_arf) &&
      refresh_frame->alt_ref_frame &&
      (current_frame->frame_type != KEY_FRAME && !frame_is_sframe(cm)))
    // Update the alternate reference frame stats as appropriate.
    update_alt_ref_frame_stats(cpi);
  else
    // Update the Golden frame stats as appropriate.
    update_golden_frame_stats(cpi);

#if CONFIG_FPMT_TEST
  /*The variables temp_avg_frame_qindex, temp_last_q, temp_avg_q,
   * temp_last_boosted_qindex are introduced only for quality simulation
   * purpose, it retains the value previous to the parallel encode frames. The
   * variables are updated based on the update flag.
   *
   * If there exist show_existing_frames between parallel frames, then to
   * retain the temp state do not update it. */
  int show_existing_between_parallel_frames =
      (cpi->ppi->gf_group.update_type[cpi->gf_frame_index] ==
           INTNL_OVERLAY_UPDATE &&
       cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index + 1] == 2);

  if (cpi->do_frame_data_update && !show_existing_between_parallel_frames &&
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) {
    for (int i = 0; i < FRAME_TYPES; i++) {
      p_rc->temp_last_q[i] = p_rc->last_q[i];
    }
    p_rc->temp_avg_q = p_rc->avg_q;
    p_rc->temp_last_boosted_qindex = p_rc->last_boosted_qindex;
    p_rc->temp_total_actual_bits = p_rc->total_actual_bits;
    p_rc->temp_projected_frame_size = rc->projected_frame_size;
    for (int i = 0; i < RATE_FACTOR_LEVELS; i++)
      p_rc->temp_rate_correction_factors[i] = p_rc->rate_correction_factors[i];
  }
#endif
  if (current_frame->frame_type == KEY_FRAME) {
    rc->frames_since_key = 0;
    rc->frames_since_scene_change = 0;
  }
  if (cpi->refresh_frame.golden_frame)
    rc->frame_num_last_gf_refresh = current_frame->frame_number;
  rc->prev_coded_width = cm->width;
  rc->prev_coded_height = cm->height;
  rc->frame_number_encoded++;
  rc->prev_frame_is_dropped = 0;
  rc->drop_count_consec = 0;
}